

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O3

void ncnn::pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  ulong uVar28;
  long lVar29;
  undefined1 *puVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 *puVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar37 [32];
  undefined1 in_ZMM6 [64];
  
  iVar14 = cpu_support_x86_avx_vnni_int8();
  auVar9 = _DAT_005b28a0;
  if (iVar14 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pauVar20 = (undefined1 (*) [16])AT->data;
  uVar28 = 0;
  lVar32 = (long)k;
  lVar21 = (long)i;
  if (7 < max_ii) {
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar35._8_4_ = 0xc080400;
    auVar35._0_8_ = 0xc0804000c080400;
    auVar35._12_4_ = 0xc080400;
    auVar35._16_4_ = 0xc080400;
    auVar35._20_4_ = 0xc080400;
    auVar35._24_4_ = 0xc080400;
    auVar35._28_4_ = 0xc080400;
    uVar24 = 0;
    do {
      iVar14 = A->w;
      auVar37._4_4_ = iVar14;
      auVar37._0_4_ = iVar14;
      auVar37._8_4_ = iVar14;
      auVar37._12_4_ = iVar14;
      auVar37._16_4_ = iVar14;
      auVar37._20_4_ = iVar14;
      auVar37._24_4_ = iVar14;
      auVar37._28_4_ = iVar14;
      vpmulld_avx2(auVar37,auVar10);
      if (3 < max_kk) {
        auVar9 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
        vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar9);
        halt_baddata();
      }
      iVar14 = 0;
      iVar18 = iVar14;
      if (1 < max_kk) {
        do {
          auVar37 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
          auVar37 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar37);
          in_ZMM6 = ZEXT3264(auVar37);
          auVar37 = vpshufb_avx2(auVar37,auVar9);
          auVar37 = vpermq_avx2(auVar37,0xe8);
          in_ZMM5 = ZEXT3264(auVar37);
          *pauVar20 = auVar37._0_16_;
          pauVar20 = pauVar20 + 1;
          iVar14 = iVar18 + 2;
          iVar15 = iVar18 + 3;
          iVar18 = iVar14;
        } while (iVar15 < max_kk);
      }
      iVar18 = max_kk - iVar14;
      if (iVar18 != 0 && iVar14 <= max_kk) {
        do {
          auVar37 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
          auVar37 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar37);
          auVar37 = vpshufb_avx2(auVar37,auVar35);
          in_ZMM6 = ZEXT1664(auVar37._16_16_);
          auVar8 = vpunpckldq_avx(auVar37._0_16_,auVar37._16_16_);
          in_ZMM5 = ZEXT1664(auVar8);
          *(long *)*pauVar20 = auVar8._0_8_;
          pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 8);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      uVar28 = uVar24 + 8;
      uVar23 = uVar24 + 0xf;
      uVar24 = uVar28;
    } while (uVar23 < (uint)max_ii);
  }
  lVar31 = (long)max_ii;
  if ((int)((uint)uVar28 | 3) < max_ii) {
    auVar8 = vpmovsxbd_avx(ZEXT416(0x3020100));
    uVar24 = uVar28 & 0xffffffff;
    do {
      iVar18 = A->w;
      iVar14 = 0;
      auVar36._4_4_ = iVar18;
      auVar36._0_4_ = iVar18;
      auVar36._8_4_ = iVar18;
      auVar36._12_4_ = iVar18;
      vpmulld_avx(auVar36,auVar8);
      if (3 < max_kk) {
        auVar8 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        vpgatherdd((undefined1  [16])0x0,auVar8);
        halt_baddata();
      }
      iVar18 = iVar14;
      if (1 < max_kk) {
        do {
          auVar36 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
          auVar36 = vpgatherdd((undefined1  [16])0x0,auVar36);
          in_ZMM6 = ZEXT1664(auVar36);
          auVar36 = vpshufb_avx(auVar36,ZEXT816(0xd0c090805040100));
          in_ZMM5 = ZEXT1664(auVar36);
          *(long *)*pauVar20 = auVar36._0_8_;
          pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 8);
          iVar14 = iVar18 + 2;
          iVar15 = iVar18 + 3;
          iVar18 = iVar14;
        } while (iVar15 < max_kk);
      }
      iVar18 = max_kk - iVar14;
      if (iVar18 != 0 && iVar14 <= max_kk) {
        do {
          auVar36 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
          auVar36 = vpgatherdd((undefined1  [16])0x0,auVar36);
          in_ZMM6 = ZEXT1664(auVar36);
          auVar36 = vpshufb_avx(auVar36,SUB6416(ZEXT464(0xc080400),0));
          in_ZMM5 = ZEXT1664(auVar36);
          *(int *)*pauVar20 = auVar36._0_4_;
          pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 4);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      uVar28 = uVar24 + 4;
      lVar25 = uVar24 + 7;
      uVar24 = uVar28;
    } while (lVar25 < lVar31);
  }
  if ((int)((uint)uVar28 | 1) < max_ii) {
    uVar24 = uVar28 & 0xffffffff;
    lVar25 = uVar24 + lVar21;
    lVar26 = uVar24 + lVar21 + 1;
    do {
      lVar17 = (long)A->w;
      sVar6 = A->elemsize;
      pvVar7 = A->data;
      if (max_kk < 4) {
        lVar11 = (uVar24 + lVar21) * sVar6 * lVar17 + lVar32;
        lVar29 = (uVar24 + lVar21 + 1) * sVar6 * lVar17 + lVar32;
        uVar16 = 0;
      }
      else {
        lVar29 = sVar6 * lVar26 * lVar17;
        lVar11 = lVar29 + lVar32;
        lVar17 = sVar6 * lVar25 * lVar17;
        lVar12 = lVar17 + lVar32;
        pauVar22 = (undefined1 (*) [16])((long)*pauVar20 + 8);
        iVar14 = 0;
        iVar18 = 0;
        lVar13 = 0;
        do {
          lVar33 = lVar13;
          cVar1 = *(char *)((long)pvVar7 + lVar33 + lVar12);
          *(char *)((long)*pauVar20 + lVar33 * 2) = cVar1;
          cVar2 = *(char *)((long)pvVar7 + lVar33 + lVar12 + 1);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 1) = cVar2;
          cVar3 = *(char *)((long)pvVar7 + lVar33 + lVar12 + 2);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 2) = cVar3;
          cVar4 = *(char *)((long)pvVar7 + lVar33 + lVar12 + 3);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 3) = cVar4;
          cVar5 = *(char *)((long)pvVar7 + lVar33 + lVar11);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 4) = cVar5;
          iVar18 = iVar18 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          cVar1 = *(char *)((long)pvVar7 + lVar33 + lVar11 + 1);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 5) = cVar1;
          cVar2 = *(char *)((long)pvVar7 + lVar33 + lVar11 + 2);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 6) = cVar2;
          cVar3 = *(char *)((long)pvVar7 + lVar33 + lVar11 + 3);
          *(char *)((long)*pauVar20 + lVar33 * 2 + 7) = cVar3;
          iVar14 = iVar14 + cVar5 + (int)cVar1 + (int)cVar2 + (int)cVar3;
          pauVar22 = (undefined1 (*) [16])((long)*pauVar22 + 8);
          lVar13 = lVar33 + 4;
        } while ((int)lVar33 + 7 < max_kk);
        *(int *)((long)*pauVar20 + lVar33 * 2 + 8) = iVar18 * 0x7f;
        *(int *)((long)*pauVar20 + lVar33 * 2 + 0xc) = iVar14 * 0x7f;
        lVar11 = lVar33 + 4 + lVar32;
        lVar29 = lVar29 + lVar11;
        lVar11 = lVar17 + lVar11;
        pauVar20 = pauVar22;
        uVar16 = max_kk & 0xfffffffc;
      }
      puVar34 = (undefined1 *)((long)pvVar7 + lVar11);
      puVar30 = (undefined1 *)((long)pvVar7 + lVar29);
      uVar19 = uVar16 | 1;
      while ((int)uVar19 < max_kk) {
        (*pauVar20)[0] = *puVar34;
        *(undefined1 *)((long)*pauVar20 + 1) = puVar34[1];
        *(undefined1 *)((long)*pauVar20 + 2) = *puVar30;
        *(undefined1 *)((long)*pauVar20 + 3) = puVar30[1];
        pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 4);
        puVar34 = puVar34 + 2;
        puVar30 = puVar30 + 2;
        uVar19 = uVar16 + 3;
        uVar16 = uVar16 + 2;
      }
      if ((int)uVar16 < max_kk) {
        lVar17 = 0;
        do {
          (*pauVar20)[0] = puVar34[lVar17];
          *(undefined1 *)((long)*pauVar20 + 1) = puVar30[lVar17];
          pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 2);
          lVar17 = lVar17 + 1;
        } while (max_kk - uVar16 != (int)lVar17);
      }
      uVar28 = uVar24 + 2;
      lVar17 = uVar24 + 3;
      lVar26 = lVar26 + 2;
      lVar25 = lVar25 + 2;
      uVar24 = uVar28;
    } while (lVar17 < lVar31);
  }
  if ((int)uVar28 < max_ii) {
    lVar25 = (long)(int)uVar28;
    do {
      pcVar27 = (char *)((long)A->data + lVar32 + (long)A->w * (lVar25 + lVar21) * A->elemsize);
      if (max_kk < 4) {
        uVar16 = 0;
      }
      else {
        iVar14 = 0;
        iVar18 = 3;
        pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + 4);
        do {
          pauVar22 = pauVar20;
          cVar1 = *pcVar27;
          pauVar22[-1][0xc] = cVar1;
          cVar2 = pcVar27[1];
          pauVar22[-1][0xd] = cVar2;
          cVar3 = pcVar27[2];
          pauVar22[-1][0xe] = cVar3;
          cVar4 = pcVar27[3];
          pauVar22[-1][0xf] = cVar4;
          iVar14 = iVar14 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          pcVar27 = pcVar27 + 4;
          iVar18 = iVar18 + 4;
          pauVar20 = (undefined1 (*) [16])((long)*pauVar22 + 4);
        } while (iVar18 < max_kk);
        *(int *)*pauVar22 = iVar14 * 0x7f;
        uVar16 = max_kk & 0xfffffffc;
      }
      if ((int)uVar16 < max_kk) {
        lVar26 = 0;
        do {
          *(char *)((long)*pauVar20 + lVar26) = pcVar27[lVar26];
          lVar26 = lVar26 + 1;
        } while (max_kk - uVar16 != (int)lVar26);
        pauVar20 = (undefined1 (*) [16])((long)*pauVar20 + lVar26);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != lVar31);
  }
  return;
}

Assistant:

void pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}